

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

void __thiscall gimage::BasicImageIO::loadProperties(BasicImageIO *this,Properties *prop,char *name)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  ifstream in;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250;
  char *local_248;
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  uint auStack_210 [122];
  
  std::__cxx11::string::string((string *)&local_250,name,(allocator *)local_230);
  uVar6 = 0xffffffffffffffff;
  uVar4 = std::__cxx11::string::rfind((char)(string *)&local_250,0x3a);
  if (uVar4 != 0xffffffffffffffff) {
    iVar3 = std::__cxx11::string::compare((ulong)&local_250,uVar4,(char *)0x2);
    uVar6 = -(ulong)(iVar3 == 0) | uVar4;
  }
  if (uVar6 == 0xffffffffffffffff) {
LAB_0010e96f:
    pcVar2 = local_248;
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)&local_250,0,pcVar2,(ulong)name);
    lVar5 = std::__cxx11::string::rfind((char)&local_250,0x2e);
    if (lVar5 != -1) {
      std::__cxx11::string::substr((ulong)local_230,(ulong)&local_250);
      std::__cxx11::string::operator=((string *)&local_250,(string *)local_230);
      if (local_230[0] != local_220) {
        operator_delete(local_230[0]);
      }
    }
    std::ifstream::ifstream(local_230);
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,local_250,local_248 + (long)local_250);
    std::__cxx11::string::append((char *)local_270);
    std::ifstream::open((char *)local_230,(_Ios_Openmode)local_270[0]);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    if ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] + -0x18)) & 5) == 0) {
      gutil::Properties::load((istream *)prop);
      std::ifstream::close();
    }
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,local_250,local_248 + (long)local_250);
    std::__cxx11::string::append((char *)local_270);
    std::ifstream::open((char *)local_230,(_Ios_Openmode)local_270[0]);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    if ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] + -0x18)) & 5) == 0) {
      gutil::Properties::load((istream *)prop);
      std::ifstream::close();
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_230,(ulong)&local_250);
    std::__cxx11::string::operator=((string *)&local_250,(string *)local_230);
    if (local_230[0] != local_220) {
      operator_delete(local_230[0]);
    }
    std::ifstream::ifstream(local_230);
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,local_250,local_248 + (long)local_250);
    std::__cxx11::string::append((char *)local_270);
    std::ifstream::open((char *)local_230,(_Ios_Openmode)local_270[0]);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    uVar1 = *(uint *)((long)auStack_210 + *(long *)(local_230[0] + -0x18));
    if ((uVar1 & 5) == 0) {
      gutil::Properties::load((istream *)prop);
      std::ifstream::close();
    }
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,local_250,local_248 + (long)local_250);
    std::__cxx11::string::append((char *)local_270);
    std::ifstream::open((char *)local_230,(_Ios_Openmode)local_270[0]);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    if ((*(byte *)((long)auStack_210 + *(long *)(local_230[0] + -0x18)) & 5) != 0) {
      std::ifstream::~ifstream(local_230);
      if ((uVar1 & 5) == 0) goto LAB_0010eb04;
      goto LAB_0010e96f;
    }
    gutil::Properties::load((istream *)prop);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_230);
LAB_0010eb04:
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  return;
}

Assistant:

void BasicImageIO::loadProperties(gutil::Properties &prop, const char *name) const
{
  std::string s=name;
  size_t pos;
  bool available=false;

  pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos != s.npos)
  {
    // try loading as tiled image

    s=s.substr(0, pos);

    std::ifstream in;
    in.open((s+".hdr").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      available=true;
      prop.load(in);
      in.close();
    }

    in.open((s+"_param.txt").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      available=true;
      prop.load(in);
      in.close();
    }
  }

  if (!available)
  {
    // loading as normal image

    s=name;
    pos=s.rfind('.');

    if (pos != s.npos)
    {
      s=s.substr(0, pos);
    }

    std::ifstream in;
    in.open((s+".hdr").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      prop.load(in);
      in.close();
    }

    in.open((s+"_param.txt").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      prop.load(in);
      in.close();
    }
  }
}